

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-capability.c++
# Opt level: O2

ssize_t __thiscall
capnp::Request<capnp::DynamicStruct,_capnp::DynamicStruct>::send
          (Request<capnp::DynamicStruct,_capnp::DynamicStruct> *this,int __fd,void *__buf,size_t __n
          ,int __flags)

{
  PromiseArena *pPVar1;
  void *pvVar2;
  undefined4 in_register_00000034;
  long lVar3;
  RawBrandedSchema *location;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_dynamic_capability_c__:90:13),_capnp::Response<capnp::AnyPointer>_>
  typedPromise;
  RemotePromise<capnp::AnyPointer> typelessPromise;
  void *continuationTracePtr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_a8;
  Schema local_a0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_98;
  RemotePromise<capnp::AnyPointer> local_90;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_60;
  Pipeline local_58;
  
  lVar3 = CONCAT44(in_register_00000034,__fd);
  (**(code **)**(undefined8 **)(lVar3 + 0x38))(&local_90);
  kj::Own<capnp::RequestHook,_std::nullptr_t>::dispose
            ((Own<capnp::RequestHook,_std::nullptr_t> *)(lVar3 + 0x30));
  local_a0.raw = *(RawBrandedSchema **)(lVar3 + 0x40);
  local_58.schema.super_Schema.raw =
       (Schema)kj::_::
               SimpleTransformPromiseNode<capnp::Response<capnp::AnyPointer>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-capability.c++:90:13)>
               ::anon_class_8_1_9705db31_for_func::operator();
  pPVar1 = ((PromiseArenaMember *)
           local_90.super_Promise<capnp::Response<capnp::AnyPointer>_>.super_PromiseBase.node.ptr)->
           arena;
  if (pPVar1 == (PromiseArena *)0x0 ||
      (ulong)((long)local_90.super_Promise<capnp::Response<capnp::AnyPointer>_>.super_PromiseBase.
                    node.ptr - (long)pPVar1) < 0x28) {
    pvVar2 = operator_new(0x400);
    location = (RawBrandedSchema *)((long)pvVar2 + 0x3d8);
    kj::
    ctor<kj::_::SimpleTransformPromiseNode<capnp::Response<capnp::AnyPointer>,capnp::Request<capnp::DynamicStruct,capnp::DynamicStruct>::send()::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,capnp::Request<capnp::DynamicStruct,capnp::DynamicStruct>::send()::__0,void*&>
              ((SimpleTransformPromiseNode<capnp::Response<capnp::AnyPointer>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_dynamic_capability_c__:90:13)>
                *)location,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_90,
               (anon_class_8_1_9705db31_for_func *)&local_a0,(void **)&local_58);
    *(void **)((long)pvVar2 + 0x3e0) = pvVar2;
  }
  else {
    ((PromiseArenaMember *)
    local_90.super_Promise<capnp::Response<capnp::AnyPointer>_>.super_PromiseBase.node.ptr)->arena =
         (PromiseArena *)0x0;
    location = (RawBrandedSchema *)
               &(((PromiseNode *)
                 ((long)local_90.super_Promise<capnp::Response<capnp::AnyPointer>_>.
                        super_PromiseBase.node.ptr + -0x30))->super_PromiseArenaMember).arena;
    kj::
    ctor<kj::_::SimpleTransformPromiseNode<capnp::Response<capnp::AnyPointer>,capnp::Request<capnp::DynamicStruct,capnp::DynamicStruct>::send()::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,capnp::Request<capnp::DynamicStruct,capnp::DynamicStruct>::send()::__0,void*&>
              ((SimpleTransformPromiseNode<capnp::Response<capnp::AnyPointer>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_dynamic_capability_c__:90:13)>
                *)location,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_90,
               (anon_class_8_1_9705db31_for_func *)&local_a0,(void **)&local_58);
    (((PromiseNode *)
     ((long)local_90.super_Promise<capnp::Response<capnp::AnyPointer>_>.super_PromiseBase.node.ptr +
     -0x20))->super_PromiseArenaMember)._vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_98.ptr = (PromiseNode *)0x0;
  local_60.ptr = (PromiseNode *)0x0;
  local_a8.ptr = (PromiseNode *)location;
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_60);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_98);
  local_58.typeless.hook.ptr = local_90.super_Pipeline.hook.ptr;
  local_58.schema.super_Schema.raw = *(Schema *)(lVar3 + 0x40);
  local_90.super_Pipeline.hook.ptr = (PipelineHook *)0x0;
  local_58.typeless.hook.disposer = local_90.super_Pipeline.hook.disposer;
  local_58.typeless.ops.ptr = local_90.super_Pipeline.ops.ptr;
  local_58.typeless.ops.size_ = local_90.super_Pipeline.ops.size_;
  local_58.typeless.ops.disposer = local_90.super_Pipeline.ops.disposer;
  local_90.super_Pipeline.ops.ptr = (PipelineOp *)0x0;
  local_90.super_Pipeline.ops.size_ = 0;
  (this->super_Builder).schema.super_Schema.raw = location;
  local_a8.ptr = (PromiseNode *)0x0;
  DynamicStruct::Pipeline::Pipeline((Pipeline *)&(this->super_Builder).builder,&local_58);
  AnyPointer::Pipeline::~Pipeline(&local_58.typeless);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_a8);
  RemotePromise<capnp::AnyPointer>::~RemotePromise(&local_90);
  return (ssize_t)this;
}

Assistant:

RemotePromise<DynamicStruct> Request<DynamicStruct, DynamicStruct>::send() {
  auto typelessPromise = hook->send();
  hook = nullptr;  // prevent reuse
  auto resultSchemaCopy = resultSchema;

  // Convert the Promise to return the correct response type.
  // Explicitly upcast to kj::Promise to make clear that calling .then() doesn't invalidate the
  // Pipeline part of the RemotePromise.
  auto typedPromise = kj::implicitCast<kj::Promise<Response<AnyPointer>>&>(typelessPromise)
      .then([=](Response<AnyPointer>&& response) -> Response<DynamicStruct> {
        return Response<DynamicStruct>(response.getAs<DynamicStruct>(resultSchemaCopy),
                                       kj::mv(response.hook));
      });

  // Wrap the typeless pipeline in a typed wrapper.
  DynamicStruct::Pipeline typedPipeline(resultSchema,
      kj::mv(kj::implicitCast<AnyPointer::Pipeline&>(typelessPromise)));

  return RemotePromise<DynamicStruct>(kj::mv(typedPromise), kj::mv(typedPipeline));
}